

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O0

int ERKStepWriteParameters(void *arkode_mem,FILE *fp)

{
  FILE *in_RSI;
  int retval;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  ARKodeMem local_20;
  int local_4;
  
  local_4 = erkStep_AccessStepMem
                      (in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (ARKodeMem *)in_stack_ffffffffffffffc8,(ARKodeERKStepMem *)0x1142c29);
  if (local_4 == 0) {
    local_4 = arkWriteParameters(in_stack_ffffffffffffffc8,(FILE *)0x1142c50);
    if (local_4 == 0) {
      fprintf(in_RSI,"ERKStep time step module parameters:\n");
      fprintf(in_RSI,"  Method order %i\n",(ulong)*(uint *)((long)in_stack_ffffffffffffffd8 + 0x10))
      ;
      fprintf(in_RSI,"\n");
      local_4 = 0;
    }
    else {
      arkProcessError(local_20,-0x15,"ARKode::ERKStep","ERKStepWriteParameters",
                      "Error writing ARKode infrastructure parameters");
    }
  }
  return local_4;
}

Assistant:

int ERKStepWriteParameters(void *arkode_mem, FILE *fp)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(arkode_mem, "ERKStepWriteParameters",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* output ARKode infrastructure parameters first */
  retval = arkWriteParameters(arkode_mem, fp);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ERKStep",
                    "ERKStepWriteParameters",
                    "Error writing ARKode infrastructure parameters");
    return(retval);
  }

  /* print integrator parameters to file */
  fprintf(fp, "ERKStep time step module parameters:\n");
  fprintf(fp, "  Method order %i\n",step_mem->q);
  fprintf(fp, "\n");

  return(ARK_SUCCESS);
}